

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

void Assimp::IFC::FilterPolygon
               (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *resultpoly)

{
  pointer *ppaVar1;
  aiVector3t<double> *in;
  aiVector3t<double> *paVar2;
  IfcVector3 *a;
  bool bVar3;
  ulong uVar4;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __first;
  const_iterator __last;
  FuzzyVectorCompare fz;
  IfcVector3 vmax;
  IfcVector3 vmin;
  
  in = (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)paVar2 - (long)in) / 0x18;
  if (uVar4 < 3) {
    if (paVar2 != in) {
      (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = in;
    }
  }
  else {
    vmin.x = 0.0;
    vmin.y = 0.0;
    vmin.z = 0.0;
    vmax.x = 0.0;
    vmax.y = 0.0;
    vmax.z = 0.0;
    ArrayBounds<aiVector3t<double>>(in,(uint)uVar4,&vmin,&vmax);
    fz.epsilon = ((vmax.z - vmin.z) * (vmax.z - vmin.z) +
                 (vmax.x - vmin.x) * (vmax.x - vmin.x) + (vmax.y - vmin.y) * (vmax.y - vmin.y)) /
                 1000000.0;
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                        ((resultpoly->
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (resultpoly->
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>)fz.epsilon);
    __last._M_current =
         (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                (resultpoly,(const_iterator)__first._M_current,__last);
      __last._M_current =
           (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    a = (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
    if (a != __last._M_current) {
      bVar3 = FuzzyVectorCompare::operator()(&fz,a,__last._M_current + -1);
      if (bVar3) {
        ppaVar1 = &(resultpoly->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + -1;
      }
    }
  }
  return;
}

Assistant:

void FilterPolygon(std::vector<IfcVector3>& resultpoly)
{
    if( resultpoly.size() < 3 )
    {
        resultpoly.clear();
        return;
    }

    IfcVector3 vmin, vmax;
    ArrayBounds(resultpoly.data(), static_cast<unsigned int>(resultpoly.size()), vmin, vmax);

    // filter our IfcFloat points - those may happen if a point lies
    // directly on the intersection line or directly on the clipping plane
    const IfcFloat epsilon = (vmax - vmin).SquareLength() / 1e6f;
    FuzzyVectorCompare fz(epsilon);
    std::vector<IfcVector3>::iterator e = std::unique(resultpoly.begin(), resultpoly.end(), fz);

    if( e != resultpoly.end() )
        resultpoly.erase(e, resultpoly.end());

    if( !resultpoly.empty() && fz(resultpoly.front(), resultpoly.back()) )
        resultpoly.pop_back();
}